

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O2

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  string *__rhs;
  Option *this_00;
  App *pAVar1;
  App *pAVar2;
  size_type sVar3;
  pointer ppOVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ostream *poVar8;
  pointer pbVar9;
  pointer ppAVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  uint uVar11;
  pointer ppAVar12;
  pointer ppOVar13;
  App **ppAVar14;
  string name;
  string value;
  string local_2f8;
  string commentLead;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  _Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_270;
  _Any_data local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8 [32];
  stringstream out;
  ostream local_1a8 [376];
  
  uVar11 = (uint)write_description;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  commentLead._M_dataplus._M_p = (pointer)&commentLead.field_2;
  commentLead._M_string_length = 0;
  commentLead.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::push_back((char)&commentLead);
  ::std::__cxx11::string::push_back((char)&commentLead);
  App::get_groups_abi_cxx11_(&groups,app);
  pbVar9 = groups.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ::std::__cxx11::string::string((string *)&name,"Options",(allocator *)&value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&groups,(const_iterator)pbVar9,&name);
  ::std::__cxx11::string::~string((string *)&name);
  if (write_description) {
    poVar8 = ::std::operator<<(local_1a8,(string *)&commentLead);
    ::std::__cxx11::string::string((string *)&name,(string *)&app->description_);
    poVar8 = ::std::operator<<(poVar8,(string *)&name);
    ::std::operator<<(poVar8,'\n');
    ::std::__cxx11::string::~string((string *)&name);
  }
  bVar7 = false;
  pbVar9 = groups.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar9 == groups.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      name.field_2._M_allocated_capacity = 0;
      name.field_2._8_8_ = 0;
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      App::get_subcommands(&subcommands,app,(function<bool_(const_CLI::App_*)> *)&name);
      std::_Function_base::~_Function_base((_Function_base *)&name);
      ppAVar10 = subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (ppAVar12 = subcommands.
                      super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppAVar12 != ppAVar10;
          ppAVar12 = ppAVar12 + 1) {
        pAVar1 = *ppAVar12;
        if ((pAVar1->name_)._M_string_length == 0) {
          if ((write_description) && ((pAVar1->group_)._M_string_length != 0)) {
            poVar8 = ::std::operator<<(local_1a8,'\n');
            poVar8 = ::std::operator<<(poVar8,(string *)&commentLead);
            poVar8 = ::std::operator<<(poVar8,(string *)&pAVar1->group_);
            ::std::operator<<(poVar8," Options\n");
          }
          ::std::__cxx11::string::string(local_1d8,(string *)prefix);
          (**(this->super_Config)._vptr_Config)
                    (&name,this,pAVar1,(ulong)default_also,(ulong)uVar11,local_1d8);
          ::std::operator<<(local_1a8,(string *)&name);
          ::std::__cxx11::string::~string((string *)&name);
          ::std::__cxx11::string::~string(local_1d8);
        }
      }
      for (ppAVar10 = subcommands.
                      super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppAVar10 !=
          subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppAVar10 = ppAVar10 + 1) {
        pAVar1 = *ppAVar10;
        if ((pAVar1->name_)._M_string_length != 0) {
          __rhs = &pAVar1->name_;
          __return_storage_ptr___00 = &value;
          if ((pAVar1->configurable_ == true) && (bVar7 = App::got_subcommand(app,pAVar1), bVar7)) {
            if ((prefix->_M_string_length == 0) && (app->parent_ != (App *)0x0)) {
              ::std::operator+(__return_storage_ptr___00,&app->name_,".");
              ::std::operator+(&name,__return_storage_ptr___00,__rhs);
              ::std::__cxx11::string::~string((string *)__return_storage_ptr___00);
              ppAVar14 = &app->parent_;
              while (pAVar2 = *ppAVar14, pAVar2->parent_ != (App *)0x0) {
                ::std::operator+(&local_2f8,&pAVar2->name_,".");
                ::std::operator+(&value,&local_2f8,&name);
                ::std::__cxx11::string::operator=((string *)&name,(string *)&value);
                ::std::__cxx11::string::~string((string *)&value);
                ::std::__cxx11::string::~string((string *)&local_2f8);
                ppAVar14 = &pAVar2->parent_;
              }
              poVar8 = ::std::operator<<(local_1a8,'[');
              poVar8 = ::std::operator<<(poVar8,(string *)&name);
              ::std::operator<<(poVar8,"]\n");
              ::std::__cxx11::string::~string((string *)&name);
            }
            else {
              poVar8 = ::std::operator<<(local_1a8,'[');
              poVar8 = ::std::operator<<(poVar8,(string *)prefix);
              poVar8 = ::std::operator<<(poVar8,(string *)__rhs);
              ::std::operator<<(poVar8,"]\n");
            }
            __return_storage_ptr___00 = &local_1f8;
            ::std::__cxx11::string::string
                      ((string *)__return_storage_ptr___00,"",(allocator *)&value);
            (**(this->super_Config)._vptr_Config)
                      (&name,this,pAVar1,default_also,(ulong)uVar11,__return_storage_ptr___00);
            ::std::operator<<(local_1a8,(string *)&name);
            ::std::__cxx11::string::~string((string *)&name);
          }
          else {
            ::std::operator+(__return_storage_ptr___00,prefix,__rhs);
            ::std::operator+(&local_218,__return_storage_ptr___00,".");
            (**(this->super_Config)._vptr_Config)
                      (&name,this,pAVar1,default_also,(ulong)uVar11,&local_218);
            ::std::operator<<(local_1a8,(string *)&name);
            ::std::__cxx11::string::~string((string *)&name);
            ::std::__cxx11::string::~string((string *)&local_218);
          }
          ::std::__cxx11::string::~string((string *)__return_storage_ptr___00);
        }
      }
      ::std::__cxx11::stringbuf::str();
      std::_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~_Vector_base
                (&subcommands.
                  super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&groups);
      ::std::__cxx11::string::~string((string *)&commentLead);
      ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
      return __return_storage_ptr__;
    }
    bVar6 = ::std::operator==(pbVar9,"Options");
    if (bVar6) {
      bVar6 = true;
      bVar5 = true;
      if (!bVar7) {
LAB_00106295:
        if (((write_description) && (bVar7 = ::std::operator!=(pbVar9,"Options"), bVar7)) &&
           (pbVar9->_M_string_length != 0)) {
          poVar8 = ::std::operator<<(local_1a8,'\n');
          poVar8 = ::std::operator<<(poVar8,(string *)&commentLead);
          poVar8 = ::std::operator<<(poVar8,(string *)pbVar9);
          ::std::operator<<(poVar8," Options\n");
        }
        local_258._M_unused._M_object = (void *)0x0;
        local_258._8_8_ = 0;
        local_248 = 0;
        uStack_240 = 0;
        App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                         &local_270,app,(function<bool_(const_CLI::Option_*)> *)&local_258);
        std::_Function_base::~_Function_base((_Function_base *)&local_258);
        ppOVar4 = local_270._M_impl.super__Vector_impl_data._M_finish;
        for (ppOVar13 = local_270._M_impl.super__Vector_impl_data._M_start; ppOVar13 != ppOVar4;
            ppOVar13 = ppOVar13 + 1) {
          this_00 = *ppOVar13;
          if ((((this_00->lnames_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (this_00->lnames_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) &&
              ((this_00->super_OptionBase<CLI::Option>).configurable_ == true)) &&
             ((bVar7 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)this_00,pbVar9), !bVar7 ||
              ((bVar7 = ::std::operator==(pbVar9,"Options"), bVar7 &&
               ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length == 0)))))) {
            ::std::operator+(&name,prefix,
                             (this_00->lnames_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
            Option::reduced_results_abi_cxx11_((results_t *)&local_2f8,this_00);
            detail::ini_join(&value,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_2f8,this->arraySeparator,this->arrayStart,
                             this->arrayEnd);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_2f8);
            if (value._M_string_length == 0 && default_also) {
              ::std::__cxx11::string::string((string *)&local_2f8,(string *)&this_00->default_str_);
              sVar3 = local_2f8._M_string_length;
              ::std::__cxx11::string::~string((string *)&local_2f8);
              if (sVar3 == 0) {
                if (this_00->expected_min_ == 0) {
                  ::std::__cxx11::string::assign((char *)&value);
                }
              }
              else {
                ::std::__cxx11::string::string
                          ((string *)&subcommands,(string *)&this_00->default_str_);
                detail::convert_arg_for_ini(&local_2f8,(string *)&subcommands);
                ::std::__cxx11::string::operator=((string *)&value,(string *)&local_2f8);
                ::std::__cxx11::string::~string((string *)&local_2f8);
                ::std::__cxx11::string::~string((string *)&subcommands);
              }
            }
            if (value._M_string_length != 0) {
              if ((write_description) && ((this_00->description_)._M_string_length != 0)) {
                ::std::operator<<(local_1a8,'\n');
                poVar8 = ::std::operator<<(local_1a8,(string *)&commentLead);
                ::std::__cxx11::string::string
                          ((string *)&local_238,(string *)&this_00->description_);
                detail::fix_newlines(&local_2f8,&commentLead,&local_238);
                poVar8 = ::std::operator<<(poVar8,(string *)&local_2f8);
                ::std::operator<<(poVar8,'\n');
                ::std::__cxx11::string::~string((string *)&local_2f8);
                ::std::__cxx11::string::~string((string *)&local_238);
              }
              poVar8 = ::std::operator<<(local_1a8,(string *)&name);
              poVar8 = ::std::operator<<(poVar8,this->valueDelimiter);
              poVar8 = ::std::operator<<(poVar8,(string *)&value);
              ::std::operator<<(poVar8,'\n');
            }
            ::std::__cxx11::string::~string((string *)&value);
            ::std::__cxx11::string::~string((string *)&name);
          }
        }
        std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
                  (&local_270);
        bVar5 = bVar6;
      }
    }
    else {
      bVar6 = pbVar9->_M_string_length == 0;
      bVar5 = true;
      if (!(bool)(bVar6 & bVar7)) {
        bVar6 = (bool)(bVar6 | bVar7);
        goto LAB_00106295;
      }
    }
    bVar7 = bVar5;
    pbVar9 = pbVar9 + 1;
  } while( true );
}

Assistant:

inline std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("Options"));
    if(write_description) {
        out << commentLead << app->get_description() << '\n';
    }
    for(auto &group : groups) {
        if(group == "Options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "Options" && !group.empty()) {
            out << '\n' << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {

            // Only process option with a long-name and configurable
            if(!opt->get_lnames().empty() && opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "Options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string name = prefix + opt->get_lnames()[0];
                std::string value = detail::ini_join(opt->reduced_results(), arraySeparator, arrayStart, arrayEnd);

                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str());
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    }
                }

                if(!value.empty()) {
                    if(write_description && opt->has_description()) {
                        out << '\n';
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }
    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(subcom->get_configurable() && app->got_subcommand(subcom)) {
                if(!prefix.empty() || app->get_parent() == nullptr) {
                    out << '[' << prefix << subcom->get_name() << "]\n";
                } else {
                    std::string subname = app->get_name() + "." + subcom->get_name();
                    auto p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        subname = p->get_name() + "." + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subcom->get_name() + ".");
            }
        }
    }

    return out.str();
}